

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uint128.cpp
# Opt level: O2

void __thiscall
Uint128FromString_Alpha_Test::~Uint128FromString_Alpha_Test(Uint128FromString_Alpha_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (Uint128FromString, Alpha) {
    EXPECT_EQ (pstore::uint128::from_hex_string ("FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF"),
               pstore::just (pstore::uint128{0xFFFFFFFF'FFFFFFFFU, 0xFFFFFFFF'FFFFFFFFU}));
    EXPECT_EQ (pstore::uint128::from_hex_string ("AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA"),
               pstore::just (pstore::uint128{0xAAAAAAAA'AAAAAAAAU, 0xAAAAAAAA'AAAAAAAAU}));
    EXPECT_EQ (pstore::uint128::from_hex_string ("ffffffffffffffffffffffffffffffff"),
               pstore::just (pstore::uint128{0xFFFFFFFF'FFFFFFFFU, 0xFFFFFFFF'FFFFFFFFU}));
    EXPECT_EQ (pstore::uint128::from_hex_string ("aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"),
               pstore::just (pstore::uint128{0xAAAAAAAA'AAAAAAAAU, 0xAAAAAAAA'AAAAAAAAU}));
}